

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

bool __thiscall
absl::lts_20240722::container_internal::
btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
::IsEndIterator(btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
                *this)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  field_type fVar4;
  field_type fVar5;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *this_00;
  btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *local_20;
  node_type *node;
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry_*>
  *this_local;
  
  uVar1 = this->position_;
  bVar2 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
          ::finish(this->node_);
  if (uVar1 == bVar2) {
    local_20 = this->node_;
    while (bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                   ::is_root(local_20), ((bVar3 ^ 0xffU) & 1) != 0) {
      fVar4 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              ::position(local_20);
      this_00 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                ::parent(local_20);
      fVar5 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
              ::finish(this_00);
      if (fVar4 != fVar5) {
        return false;
      }
      local_20 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                 ::parent(local_20);
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsEndIterator() const {
    if (position_ != node_->finish()) return false;
    node_type *node = node_;
    while (!node->is_root()) {
      if (node->position() != node->parent()->finish()) return false;
      node = node->parent();
    }
    return true;
  }